

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenBadKeyTest_BadKey_Test>::CreateTest
          (ParameterizedTestFactory<bssl::(anonymous_namespace)::TrustTokenBadKeyTest_BadKey_Test>
           *this)

{
  undefined1 uVar1;
  trust_token_method_st *ptVar2;
  Test *this_00;
  ParamType *pPVar3;
  
  WithParamInterface<std::tuple<trust_token_method_st_const*,bool,bool,int>>::parameter_ =
       &this->parameter_;
  this_00 = (Test *)operator_new(0x58);
  pPVar3 = WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::GetParam
                     ();
  ptVar2 = (pPVar3->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
           super__Head_base<0UL,_const_trust_token_method_st_*,_false>._M_head_impl;
  pPVar3 = WithParamInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::GetParam
                     ();
  uVar1 = (pPVar3->super__Tuple_impl<0UL,_const_trust_token_method_st_*,_bool,_bool,_int>).
          super__Tuple_impl<1UL,_bool,_bool,_int>.super__Tuple_impl<2UL,_bool,_int>.field_0x5;
  Test::Test(this_00);
  this_00[1]._vptr_Test = (_func_int **)ptVar2;
  *(undefined1 *)
   &this_00[1].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = uVar1;
  *(undefined4 *)
   ((long)&this_00[1].gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl + 2) =
       0xa000a;
  this_00[2]._vptr_Test = (_func_int **)0x0;
  this_00[2].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__TrustTokenBadKeyTest_0070a958;
  this_00[5]._vptr_Test = (_func_int **)&PTR__TrustTokenBadKeyTest_BadKey_Test_0070a998;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }